

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall
Fl_Text_Display::extend_range_for_styles(Fl_Text_Display *this,int *startpos,int *endpos)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Fl_Text_Selection *this_00;
  Fl_Text_Buffer *pFVar8;
  int extended;
  Fl_Text_Selection *sel;
  int *endpos_local;
  int *startpos_local;
  Fl_Text_Display *this_local;
  
  this_00 = Fl_Text_Buffer::primary_selection(this->mStyleBuffer);
  bVar1 = false;
  bVar2 = Fl_Text_Selection::selected(this_00);
  if (bVar2) {
    iVar3 = Fl_Text_Selection::start(this_00);
    iVar7 = *startpos;
    if (iVar3 < iVar7) {
      iVar4 = Fl_Text_Selection::start(this_00);
      *startpos = iVar4;
      pFVar8 = buffer(this);
      iVar4 = Fl_Text_Buffer::utf8_align(pFVar8,*startpos);
      *startpos = iVar4;
    }
    iVar5 = Fl_Text_Selection::end(this_00);
    iVar4 = *endpos;
    if (iVar4 < iVar5) {
      iVar6 = Fl_Text_Selection::end(this_00);
      *endpos = iVar6;
      pFVar8 = buffer(this);
      iVar6 = Fl_Text_Buffer::utf8_align(pFVar8,*endpos);
      *endpos = iVar6;
    }
    bVar1 = iVar4 < iVar5 || iVar3 < iVar7;
  }
  if (bVar1) {
    iVar7 = Fl_Text_Buffer::line_end(this->mBuffer,*endpos);
    *endpos = iVar7 + 1;
  }
  return;
}

Assistant:

void Fl_Text_Display::extend_range_for_styles( int *startpos, int *endpos ) {
  IS_UTF8_ALIGNED2(buffer(), (*startpos))
  IS_UTF8_ALIGNED2(buffer(), (*endpos))

  Fl_Text_Selection * sel = mStyleBuffer->primary_selection();
  int extended = 0;

  /* The peculiar protocol used here is that modifications to the style
   buffer are marked by selecting them with the buffer's primary Fl_Text_Selection.
   The style buffer is usually modified in response to a modify callback on
   the text buffer BEFORE Fl_Text_Display.c's modify callback, so that it can keep
   the style buffer in step with the text buffer.  The style-update
   callback can't just call for a redraw, because Fl_Text_Display hasn't processed
   the original text changes yet.  Anyhow, to minimize redrawing and to
   avoid the complexity of scheduling redraws later, this simple protocol
   tells the text display's buffer modify callback to extend its redraw
   range to show the text color/and font changes as well. */
  if ( sel->selected() ) {
    if ( sel->start() < *startpos ) {
      *startpos = sel->start();
      // somewhere while deleting, alignment is lost. We do this just to be sure.
      *startpos = buffer()->utf8_align(*startpos);
      IS_UTF8_ALIGNED2(buffer(), (*startpos))
      extended = 1;
    }
    if ( sel->end() > *endpos ) {
      *endpos = sel->end();
      *endpos = buffer()->utf8_align(*endpos);
      IS_UTF8_ALIGNED2(buffer(), (*endpos))
      extended = 1;
    }
  }

  /* If the Fl_Text_Selection was extended due to a style change, and some of the
   fonts don't match in spacing, extend redraw area to end of line to
   redraw characters exposed by possible font size changes */
  if ( extended )
    *endpos = mBuffer->line_end( *endpos ) + 1;

  IS_UTF8_ALIGNED2(buffer(), (*endpos))
}